

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,QChar c)

{
  _Head_base<0UL,_QTextStreamPrivate_*,_false> this_00;
  QString *this_01;
  long in_FS_OFFSET;
  QChar local_1a;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
       super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  this_01 = (this_00._M_head_impl)->string;
  if ((this_01 != (QString *)0x0) || ((this_00._M_head_impl)->device != (QIODevice *)0x0)) {
    local_1a.ucs = c.ucs;
    if (*(int *)((long)&(this_00._M_head_impl)->params + 8) < 1) {
      if (this_01 == (QString *)0x0) {
        QString::append(&(this_00._M_head_impl)->writeBuffer,c);
        if (0x4000 < (ulong)*(qsizetype *)((long)&(this_00._M_head_impl)->writeBuffer + 0x10)) {
          QTextStreamPrivate::flushWriteBuffer(this_00._M_head_impl);
        }
      }
      else {
        QString::append(this_01,c);
      }
    }
    else {
      QTextStreamPrivate::putString(this_00._M_head_impl,&local_1a,1,false);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(QChar c)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putChar(c);
    return *this;
}